

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O2

void lj_ffrecord_func(jit_State *J)

{
  uint uVar1;
  ulong uVar2;
  RecordFFData rd;
  RecordFFData local_28;
  
  uVar2 = (ulong)(J->fn->c).ffid;
  uVar1 = 0;
  if (uVar2 < 0xca) {
    uVar1 = (uint)recff_idmap[uVar2];
  }
  local_28.data = uVar1 & 0xff;
  local_28.nres = 1;
  local_28.argv = J->L->base;
  J->base[J->maxslot] = 0;
  (*recff_func[uVar1 >> 8])(J,&local_28);
  if (-1 < local_28.nres) {
    if (J->postproc == LJ_POST_NONE) {
      J->postproc = LJ_POST_FFRETRY;
    }
    lj_record_ret(J,0,local_28.nres);
  }
  return;
}

Assistant:

void lj_ffrecord_func(jit_State *J)
{
  RecordFFData rd;
  uint32_t m = recdef_lookup(J->fn);
  rd.data = m & 0xff;
  rd.nres = 1;  /* Default is one result. */
  rd.argv = J->L->base;
  J->base[J->maxslot] = 0;  /* Mark end of arguments. */
  (recff_func[m >> 8])(J, &rd);  /* Call recff_* handler. */
  if (rd.nres >= 0) {
    if (J->postproc == LJ_POST_NONE) J->postproc = LJ_POST_FFRETRY;
    lj_record_ret(J, 0, rd.nres);
  }
}